

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDRefactor(Abc_Ntk_t *pNtk,Dar_RefPar_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAig;
  Aig_Man_t *pMan_00;
  abctime clk;
  Abc_Ntk_t *pNtkAig;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Dar_RefPar_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    pAig = Abc_NtkToDar(pNtk,0,0);
    if (pAig == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      Dar_ManRefactor(pAig,pPars);
      Abc_Clock();
      pMan_00 = Aig_ManDupDfs(pAig);
      Aig_ManStop(pAig);
      pNtk_local = Abc_NtkFromDar(pNtk,pMan_00);
      Aig_ManStop(pMan_00);
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x618,"Abc_Ntk_t *Abc_NtkDRefactor(Abc_Ntk_t *, Dar_RefPar_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDRefactor( Abc_Ntk_t * pNtk, Dar_RefPar_t * pPars )
{
    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
//    Aig_ManPrintStats( pMan );

    Dar_ManRefactor( pMan, pPars );
//    pMan = Dar_ManBalance( pTemp = pMan, pPars->fUpdateLevel );
//    Aig_ManStop( pTemp );

clk = Abc_Clock();
    pMan = Aig_ManDupDfs( pTemp = pMan ); 
    Aig_ManStop( pTemp );
//ABC_PRT( "time", Abc_Clock() - clk );

//    Aig_ManPrintStats( pMan );
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}